

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O3

void polyscope::view::setNavigateStyle(NavigateStyle newStyle,bool animateFlight)

{
  int iVar1;
  bool bVar2;
  mat4x4 T;
  mat4 mStack_48;
  
  iVar1 = style;
  style = newStyle;
  if ((newStyle == Free) || ((newStyle == FirstPerson && (iVar1 == 0)))) {
    return;
  }
  if (animateFlight) {
    computeHomeView();
    nearClipRatio = 0x3f747ae147ae147b;
    farClipRatio = 0x4034000000000000;
    startFlightTo(&mStack_48,45.0,0.4);
    return;
  }
  bVar2 = viewIsValid();
  if (bVar2) {
    computeHomeView();
    fov = 0x4046800000000000;
    nearClipRatio = 0x3f747ae147ae147b;
    viewMat._0_4_ = mStack_48.value[0].field_0;
    viewMat._4_4_ = mStack_48.value[0].field_1;
    DAT_005fc68c = mStack_48.value[0].field_2;
    _DAT_005fc690 = mStack_48.value[0].field_3;
    DAT_005fc694._0_4_ = mStack_48.value[1].field_0;
    DAT_005fc694._4_4_ = mStack_48.value[1].field_1;
    DAT_005fc69c = mStack_48.value[1].field_2;
    _DAT_005fc6a0 = mStack_48.value[1].field_3;
    DAT_005fc6a4._0_4_ = mStack_48.value[2].field_0;
    DAT_005fc6a4._4_4_ = mStack_48.value[2].field_1;
    DAT_005fc6ac._0_4_ = mStack_48.value[2].field_2;
    DAT_005fc6ac._4_4_ = mStack_48.value[2].field_3;
    DAT_005fc6b4._0_4_ = mStack_48.value[3].field_0;
    DAT_005fc6b4._4_4_ = mStack_48.value[3].field_1;
    DAT_005fc6bc._0_4_ = mStack_48.value[3].field_2;
    DAT_005fc6bc._4_4_ = mStack_48.value[3].field_3;
    farClipRatio = 0x4034000000000000;
    requestRedraw();
    return;
  }
  return;
}

Assistant:

void setNavigateStyle(NavigateStyle newStyle, bool animateFlight) {
  NavigateStyle oldStyle = style;
  style = newStyle;

  // for a few combinations of views, we can leave the camera where it is rather than resetting to the home view
  if (newStyle == NavigateStyle::Free ||
      (newStyle == NavigateStyle::FirstPerson && oldStyle == NavigateStyle::Turntable)) {
    return;
  }

  // reset to the home view
  if (animateFlight) {
    flyToHomeView();
  } else {
    resetCameraToHomeView();
  }
}